

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

void xmlFreeProp(xmlAttrPtr cur)

{
  int iVar1;
  xmlDeregisterNodeFunc *pp_Var2;
  xmlChar *str;
  _xmlDict *dict;
  
  if (cur == (xmlAttrPtr)0x0) {
    return;
  }
  if (cur->doc == (_xmlDoc *)0x0) {
    dict = (xmlDictPtr)0x0;
  }
  else {
    dict = cur->doc->dict;
  }
  if (__xmlRegisterCallbacks != 0) {
    pp_Var2 = __xmlDeregisterNodeDefaultValue();
    if (*pp_Var2 != (xmlDeregisterNodeFunc)0x0) {
      pp_Var2 = __xmlDeregisterNodeDefaultValue();
      (**pp_Var2)((xmlNodePtr)cur);
    }
  }
  if ((cur->doc != (xmlDocPtr)0x0) && (cur->atype == XML_ATTRIBUTE_ID)) {
    xmlRemoveID(cur->doc,cur);
  }
  if (cur->children != (xmlNodePtr)0x0) {
    xmlFreeNodeList(cur->children);
  }
  str = cur->name;
  if (str != (xmlChar *)0x0) {
    if (dict != (xmlDictPtr)0x0) {
      iVar1 = xmlDictOwns(dict,str);
      if (iVar1 != 0) goto LAB_0017f18e;
      str = cur->name;
    }
    (*xmlFree)(str);
  }
LAB_0017f18e:
  (*xmlFree)(cur);
  return;
}

Assistant:

void
xmlFreeProp(xmlAttrPtr cur) {
    xmlDictPtr dict = NULL;
    if (cur == NULL) return;

    if (cur->doc != NULL) dict = cur->doc->dict;

    if ((__xmlRegisterCallbacks) && (xmlDeregisterNodeDefaultValue))
	xmlDeregisterNodeDefaultValue((xmlNodePtr)cur);

    /* Check for ID removal -> leading to invalid references ! */
    if ((cur->doc != NULL) && (cur->atype == XML_ATTRIBUTE_ID)) {
	    xmlRemoveID(cur->doc, cur);
    }
    if (cur->children != NULL) xmlFreeNodeList(cur->children);
    DICT_FREE(cur->name)
    xmlFree(cur);
}